

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

TValue * newkey(lua_State *L,Table *t,TValue *key)

{
  uint uVar1;
  global_State *pgVar2;
  Value VVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint uVar6;
  Node *pNVar7;
  Node *pNVar8;
  Node *pNVar9;
  TValue *pTVar10;
  uint uVar11;
  uint uVar12;
  global_State *g;
  Node *pNVar13;
  int iVar14;
  uint nasize;
  long lVar15;
  GCObject *o;
  int ause;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  long lVar22;
  int *piVar23;
  Node *pNVar24;
  int iVar25;
  int nums [31];
  int local_b8 [34];
  
  pNVar7 = mainposition(t,key);
  if ((pNVar7 == &dummynode_) || (pNVar24 = pNVar7, (pNVar7->i_val).tt != 0)) {
    pNVar8 = t->node;
    pNVar24 = t->lastfree;
    do {
      pNVar13 = pNVar24;
      pNVar24 = pNVar13 + -1;
      t->lastfree = pNVar24;
      if (pNVar13 <= pNVar8) {
        local_b8[0x1c] = 0;
        local_b8[0x1d] = 0;
        local_b8[0x1e] = 0;
        local_b8[0x18] = 0;
        local_b8[0x19] = 0;
        local_b8[0x1a] = 0;
        local_b8[0x1b] = 0;
        local_b8[0x14] = 0;
        local_b8[0x15] = 0;
        local_b8[0x16] = 0;
        local_b8[0x17] = 0;
        local_b8[0x10] = 0;
        local_b8[0x11] = 0;
        local_b8[0x12] = 0;
        local_b8[0x13] = 0;
        local_b8[0xc] = 0;
        local_b8[0xd] = 0;
        local_b8[0xe] = 0;
        local_b8[0xf] = 0;
        local_b8[8] = 0;
        local_b8[9] = 0;
        local_b8[10] = 0;
        local_b8[0xb] = 0;
        local_b8[4] = 0;
        local_b8[5] = 0;
        local_b8[6] = 0;
        local_b8[7] = 0;
        local_b8[0] = 0;
        local_b8[1] = 0;
        local_b8[2] = 0;
        local_b8[3] = 0;
        iVar14 = t->sizearray;
        lVar15 = 0;
        iVar19 = 1;
        iVar16 = 0;
        iVar25 = 1;
        goto LAB_00107c72;
      }
    } while (pNVar13[-1].i_key.nk.tt != 0);
    pNVar8 = mainposition(t,&(pNVar7->i_key).tvk);
    if (pNVar8 == pNVar7) {
      pNVar13[-1].i_key.nk.next = (pNVar7->i_key).nk.next;
      (pNVar7->i_key).nk.next = pNVar24;
    }
    else {
      do {
        pNVar9 = pNVar8;
        pNVar8 = (pNVar9->i_key).nk.next;
      } while (pNVar8 != pNVar7);
      (pNVar9->i_key).nk.next = pNVar24;
      pNVar13[-1].i_key.nk.next = (pNVar7->i_key).nk.next;
      VVar3 = (pNVar7->i_val).value;
      iVar14 = (pNVar7->i_val).tt;
      uVar5 = *(undefined4 *)&(pNVar7->i_val).field_0xc;
      uVar4 = *(undefined8 *)((long)&pNVar7->i_key + 8);
      pNVar13[-1].i_key.nk.value = (pNVar7->i_key).nk.value;
      *(undefined8 *)((long)&pNVar13[-1].i_key + 8) = uVar4;
      (pNVar24->i_val).value = VVar3;
      pNVar13[-1].i_val.tt = iVar14;
      *(undefined4 *)&pNVar13[-1].i_val.field_0xc = uVar5;
      (pNVar7->i_key).nk.next = (Node *)0x0;
      (pNVar7->i_val).tt = 0;
      pNVar24 = pNVar7;
    }
  }
  (pNVar24->i_key).nk.value = key->value;
  iVar14 = key->tt;
  (pNVar24->i_key).nk.tt = iVar14;
  if (((3 < iVar14) && (((((key->value).gc)->gch).marked & 3) != 0)) && ((t->marked & 4) != 0)) {
    pgVar2 = L->l_G;
    t->marked = t->marked & 0xfb;
    t->gclist = pgVar2->grayagain;
    pgVar2->grayagain = (GCObject *)t;
  }
  return &pNVar24->i_val;
  while( true ) {
    iVar20 = 0;
    if (iVar19 <= iVar18) {
      lVar22 = (long)iVar19 + -1;
      piVar23 = &t->array[(long)iVar19 + -1].tt;
      iVar20 = 0;
      do {
        iVar20 = (iVar20 + 1) - (uint)(*piVar23 == 0);
        lVar22 = lVar22 + 1;
        piVar23 = piVar23 + 4;
      } while (lVar22 < iVar18);
      iVar19 = iVar18 + 1;
    }
    local_b8[lVar15] = local_b8[lVar15] + iVar20;
    iVar16 = iVar16 + iVar20;
    lVar15 = lVar15 + 1;
    iVar25 = iVar25 * 2;
    if (lVar15 == 0x1f) break;
LAB_00107c72:
    iVar18 = iVar25;
    if ((iVar14 < iVar25) && (iVar18 = iVar14, iVar14 < iVar19)) break;
  }
  iVar25 = 0;
  iVar14 = 0;
  if (t->lsizenode < 0x20) {
    lVar15 = (0x100000000 << (t->lsizenode & 0x3f)) >> 0x20;
    piVar23 = &pNVar8[lVar15 + -1].i_val.tt;
    iVar14 = 0;
    iVar25 = 0;
    do {
      if (*piVar23 != 0) {
        iVar19 = countint((TValue *)(piVar23 + 2),local_b8);
        iVar25 = iVar25 + iVar19;
        iVar14 = iVar14 + 1;
      }
      lVar15 = lVar15 + -1;
      piVar23 = piVar23 + -10;
    } while (lVar15 != 0);
  }
  piVar23 = local_b8;
  iVar19 = countint(key,piVar23);
  nasize = 0;
  uVar6 = iVar19 + iVar25 + iVar16;
  uVar21 = 0;
  if (uVar6 != 0 && SCARRY4(iVar19,iVar25 + iVar16) == (int)uVar6 < 0) {
    uVar12 = 0;
    nasize = 0;
    uVar21 = 0;
    uVar17 = 0;
    uVar11 = 1;
    do {
      iVar25 = *piVar23;
      uVar1 = iVar25 + uVar17;
      if (0 < iVar25) {
        uVar17 = uVar1;
      }
      if (0 < iVar25 && (int)uVar12 < (int)uVar1) {
        nasize = uVar11;
        uVar21 = uVar1;
      }
      if (uVar17 == uVar6) break;
      uVar12 = uVar11 & 0x7fffffff;
      piVar23 = piVar23 + 1;
      uVar11 = uVar11 * 2;
    } while (uVar12 < uVar6);
  }
  resize(L,t,nasize,((iVar16 + iVar14) - uVar21) + 1);
  pTVar10 = luaH_set(L,t,key);
  return pTVar10;
}

Assistant:

static TValue*newkey(lua_State*L,Table*t,const TValue*key){
Node*mp=mainposition(t,key);
if(!ttisnil(gval(mp))||mp==(&dummynode_)){
Node*othern;
Node*n=getfreepos(t);
if(n==NULL){
rehash(L,t,key);
return luaH_set(L,t,key);
}
othern=mainposition(t,key2tval(mp));
if(othern!=mp){
while(gnext(othern)!=mp)othern=gnext(othern);
gnext(othern)=n;
*n=*mp;
gnext(mp)=NULL;
setnilvalue(gval(mp));
}
else{
gnext(n)=gnext(mp);
gnext(mp)=n;
mp=n;
}
}
gkey(mp)->value=key->value;gkey(mp)->tt=key->tt;
luaC_barriert(L,t,key);
return gval(mp);
}